

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O0

RealType __thiscall OpenMD::NPTf::calcConservedQuantity(NPTf *this)

{
  int iVar1;
  long *in_RDI;
  RealType RVar2;
  double dVar3;
  SquareMatrix<double,_3> tmp;
  RealType trEta;
  RealType barostat_potential;
  RealType barostat_kinetic;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType totalEnergy;
  RealType conservedQuantity;
  SquareMatrix<double,_3> *in_stack_fffffffffffffe88;
  SimInfo *in_stack_fffffffffffffe90;
  Thermo *this_00;
  Thermo *in_stack_fffffffffffffea0;
  SquareMatrix3<double> *m2;
  SquareMatrix3<double> *in_stack_fffffffffffffec8;
  SquareMatrix3<double> local_128 [2];
  SquareMatrix<double,_3> local_98;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  RealType local_28;
  double local_20;
  pair<double,_double> local_18;
  
  local_18 = Snapshot::getThermostat((Snapshot *)in_RDI[0x1c]);
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x34),&local_18);
  (**(code **)(*in_RDI + 0xc0))();
  iVar1 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0xe]);
  in_RDI[0x1f] = (long)((double)iVar1 * 8.31451e-07 * (double)in_RDI[0x26]);
  iVar1 = SimInfo::getNdf(in_stack_fffffffffffffe90);
  in_RDI[0x20] = (long)((double)iVar1 * 8.31451e-07 * (double)in_RDI[0x26]);
  local_28 = Thermo::getTotalEnergy(in_stack_fffffffffffffea0);
  local_30 = ((double)in_RDI[0x20] * (double)in_RDI[0x21] * (double)in_RDI[0x34] *
             (double)in_RDI[0x34]) / 0.0008368;
  local_38 = ((double)in_RDI[0x20] * (double)in_RDI[0x35]) / 0.0004184;
  m2 = (SquareMatrix3<double> *)(in_RDI + 0x41);
  SquareMatrix3<double>::transpose(local_128);
  OpenMD::operator*(in_stack_fffffffffffffec8,m2);
  SquareMatrix<double,_3>::SquareMatrix
            ((SquareMatrix<double,_3> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217fb7);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x217fc1);
  local_50 = SquareMatrix<double,_3>::trace(&local_98);
  local_40 = ((double)in_RDI[0x1f] * (double)in_RDI[0x22] * local_50) / 0.0008368;
  this_00 = (Thermo *)in_RDI[0x27];
  RVar2 = Thermo::getVolume(this_00);
  local_48 = (((double)this_00 * RVar2) / 163882576.0) / 0.0004184;
  dVar3 = local_28 + local_30 + local_38 + local_40 + local_48;
  local_20 = dVar3;
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2180c4);
  return dVar3;
}

Assistant:

RealType NPTf::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }